

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.cpp
# Opt level: O0

void __thiscall
spvtools::opt::anon_unknown_8::ComputeRegisterLiveness::ComputePartialLiveness
          (ComputeRegisterLiveness *this,BasicBlock *bb)

{
  RegisterLiveness *this_00;
  reference this_01;
  bool bVar1;
  uint32_t bb_id;
  Op OVar2;
  RegionRegisterLiveness *pRVar3;
  anon_class_16_2_59a58641 local_f0;
  function<void_(unsigned_int_*)> local_e0;
  reference local_c0 [3];
  reference local_a8;
  reference local_a0;
  Instruction *insn;
  reverse_iterator<spvtools::opt::InstructionList::iterator> __end3;
  reverse_iterator<spvtools::opt::InstructionList::iterator> __begin3;
  undefined1 local_80 [8];
  undefined1 local_78 [24];
  IteratorRange<std::reverse_iterator<spvtools::opt::InstructionList::iterator>_> *__range3;
  IRContext *local_58;
  IRContext *local_50;
  function<void_(unsigned_int)> local_48;
  RegionRegisterLiveness *local_28;
  BasicBlock *cbb;
  RegionRegisterLiveness *live_inout;
  BasicBlock *bb_local;
  ComputeRegisterLiveness *this_local;
  
  live_inout = (RegionRegisterLiveness *)bb;
  bb_local = (BasicBlock *)this;
  pRVar3 = RegisterLiveness::Get(this->reg_pressure_,bb);
  if (pRVar3 != (RegionRegisterLiveness *)0x0) {
    __assert_fail("reg_pressure_->Get(bb) == nullptr && \"Basic block already processed\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/register_pressure.cpp"
                  ,0x79,
                  "void spvtools::opt::(anonymous namespace)::ComputeRegisterLiveness::ComputePartialLiveness(BasicBlock *)"
                 );
  }
  this_00 = this->reg_pressure_;
  bb_id = BasicBlock::id((BasicBlock *)live_inout);
  cbb = (BasicBlock *)RegisterLiveness::GetOrInsert(this_00,bb_id);
  ComputePhiUses(this,(BasicBlock *)live_inout,&((RegionRegisterLiveness *)cbb)->live_out_);
  pRVar3 = live_inout;
  local_28 = live_inout;
  __range3 = (IteratorRange<std::reverse_iterator<spvtools::opt::InstructionList::iterator>_> *)&cbb
  ;
  local_58 = (IRContext *)live_inout;
  local_50 = (IRContext *)this;
  std::function<void(unsigned_int)>::
  function<spvtools::opt::(anonymous_namespace)::ComputeRegisterLiveness::ComputePartialLiveness(spvtools::opt::BasicBlock*)::_lambda(unsigned_int)_1_,void>
            ((function<void(unsigned_int)> *)&local_48,(anon_class_24_3_04321d7b *)&__range3);
  BasicBlock::ForEachSuccessorLabel((BasicBlock *)pRVar3,&local_48);
  std::function<void_(unsigned_int)>::~function(&local_48);
  std::
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  ::operator=((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
               *)cbb,(unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                      *)&(cbb->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                         context_);
  BasicBlock::rbegin((BasicBlock *)local_80);
  BasicBlock::rend((BasicBlock *)&__begin3);
  make_range<std::reverse_iterator<spvtools::opt::InstructionList::iterator>>
            ((opt *)local_78,(reverse_iterator<spvtools::opt::InstructionList::iterator> *)local_80,
             &__begin3);
  local_78._16_8_ = local_78;
  IteratorRange<std::reverse_iterator<spvtools::opt::InstructionList::iterator>_>::begin
            ((IteratorRange<std::reverse_iterator<spvtools::opt::InstructionList::iterator>_> *)
             &__end3);
  IteratorRange<std::reverse_iterator<spvtools::opt::InstructionList::iterator>_>::end
            ((IteratorRange<std::reverse_iterator<spvtools::opt::InstructionList::iterator>_> *)
             &insn);
  while( true ) {
    bVar1 = std::operator!=(&__end3,(reverse_iterator<spvtools::opt::InstructionList::iterator> *)
                                    &insn);
    if (!bVar1) {
      return;
    }
    local_a0 = std::reverse_iterator<spvtools::opt::InstructionList::iterator>::operator*(&__end3);
    OVar2 = Instruction::opcode(local_a0);
    if (OVar2 == OpPhi) break;
    local_c0[0] = local_a0;
    std::
    unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
    ::erase((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
             *)cbb,local_c0);
    this_01 = local_a0;
    local_f0.live_inout = (RegionRegisterLiveness *)cbb;
    local_f0.this = this;
    std::function<void(unsigned_int*)>::
    function<spvtools::opt::(anonymous_namespace)::ComputeRegisterLiveness::ComputePartialLiveness(spvtools::opt::BasicBlock*)::_lambda(unsigned_int*)_1_,void>
              ((function<void(unsigned_int*)> *)&local_e0,&local_f0);
    Instruction::ForEachInId(this_01,&local_e0);
    std::function<void_(unsigned_int_*)>::~function(&local_e0);
    std::reverse_iterator<spvtools::opt::InstructionList::iterator>::operator++(&__end3);
  }
  local_a8 = local_a0;
  std::
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  ::insert((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
            *)cbb,&local_a8);
  return;
}

Assistant:

void ComputePartialLiveness(BasicBlock* bb) {
    assert(reg_pressure_->Get(bb) == nullptr &&
           "Basic block already processed");

    RegisterLiveness::RegionRegisterLiveness* live_inout =
        reg_pressure_->GetOrInsert(bb->id());
    ComputePhiUses(*bb, &live_inout->live_out_);

    const BasicBlock* cbb = bb;
    cbb->ForEachSuccessorLabel([&live_inout, bb, this](uint32_t sid) {
      // Skip back edges.
      if (dom_tree_.Dominates(sid, bb->id())) {
        return;
      }

      BasicBlock* succ_bb = cfg_.block(sid);
      RegisterLiveness::RegionRegisterLiveness* succ_live_inout =
          reg_pressure_->Get(succ_bb);
      assert(succ_live_inout &&
             "Successor liveness analysis was not performed");

      ExcludePhiDefinedInBlock predicate(context_, succ_bb);
      auto filter =
          MakeFilterIteratorRange(succ_live_inout->live_in_.begin(),
                                  succ_live_inout->live_in_.end(), predicate);
      live_inout->live_out_.insert(filter.begin(), filter.end());
    });

    live_inout->live_in_ = live_inout->live_out_;
    for (Instruction& insn : make_range(bb->rbegin(), bb->rend())) {
      if (insn.opcode() == spv::Op::OpPhi) {
        live_inout->live_in_.insert(&insn);
        break;
      }
      live_inout->live_in_.erase(&insn);
      insn.ForEachInId([live_inout, this](uint32_t* id) {
        Instruction* insn_op = def_use_manager_.GetDef(*id);
        if (CreatesRegisterUsage(insn_op)) {
          live_inout->live_in_.insert(insn_op);
        }
      });
    }
  }